

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::DataEntryCoarseRPN(Renderer *this,int chan,int rpn,int val)

{
  if (rpn != 0) {
    return;
  }
  this->channel[chan].pitchsens = val * 100 + this->channel[chan].pitchsens % 100;
  this->channel[chan].pitchfactor = 0.0;
  return;
}

Assistant:

void Renderer::DataEntryCoarseRPN(int chan, int rpn, int val)
{
	switch (rpn)
	{
	case RPN_PITCH_SENS:
		channel[chan].pitchsens = (channel[chan].pitchsens % 100) + (val * 100);
		channel[chan].pitchfactor = 0;
		break;

	// TiMidity resets the pitch sensitivity when a song attempts to write to
	// RPN_RESET. My docs tell me this is just a dummy value that is guaranteed
	// to not cause future data entry to go anywhere until a new RPN is set.
	}
}